

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dir_nav_kernel_2.h
# Opt level: O1

type dlib::
     directory_helper_get_files<dlib::queue_kernel_c<dlib::queue_kernel_1<dlib::file,dlib::memory_manager_stateless_kernel_1<char>>>>
               (data *state,
               queue_kernel_c<dlib::queue_kernel_1<dlib::file,_dlib::memory_manager_stateless_kernel_1<char>_>_>
               *files)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  size_type sVar3;
  pointer pcVar4;
  char cVar5;
  int iVar6;
  DIR *__dirp;
  dirent *pdVar7;
  char *pcVar8;
  size_t sVar9;
  error *peVar10;
  char *__s;
  duration dVar11;
  string *psVar12;
  string path;
  stat64 buffer;
  char buf [4096];
  undefined1 *local_1140;
  long local_1138;
  undefined1 local_1130 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1120;
  int *local_1118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1110;
  queue_kernel_1<dlib::file,_dlib::memory_manager_stateless_kernel_1<char>_> *local_10f0;
  undefined1 *local_10e8 [2];
  undefined1 local_10d8 [16];
  stat64 local_10c8;
  undefined1 local_1038 [8];
  _Alloc_hider local_1030;
  undefined1 local_1028 [24];
  _Alloc_hider local_1010;
  size_type local_1008;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1000;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_ff0;
  
  queue_kernel_1<dlib::file,_dlib::memory_manager_stateless_kernel_1<char>_>::delete_nodes
            (&files->
              super_queue_kernel_1<dlib::file,_dlib::memory_manager_stateless_kernel_1<char>_>,
             (files->
             super_queue_kernel_1<dlib::file,_dlib::memory_manager_stateless_kernel_1<char>_>).out,
             (files->
             super_queue_kernel_1<dlib::file,_dlib::memory_manager_stateless_kernel_1<char>_>).
             queue_size);
  (files->super_queue_kernel_1<dlib::file,_dlib::memory_manager_stateless_kernel_1<char>_>).
  queue_size = 0;
  local_10f0 = &files->
                super_queue_kernel_1<dlib::file,_dlib::memory_manager_stateless_kernel_1<char>_>;
  (*(files->super_queue_kernel_1<dlib::file,_dlib::memory_manager_stateless_kernel_1<char>_>).
    super_enumerable<dlib::file>._vptr_enumerable[3])(files);
  sVar3 = (state->full_name)._M_string_length;
  if (sVar3 == 0) {
    peVar10 = (error *)__cxa_allocate_exception(0x30);
    local_1038 = (undefined1  [8])local_1028;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1038,
               "This directory object currently doesn\'t represent any directory.","");
    error::error(peVar10,(string *)local_1038);
    *(undefined ***)peVar10 = &PTR__error_0031aaa0;
    __cxa_throw(peVar10,&directory::listing_error::typeinfo,error::~error);
  }
  psVar12 = &state->full_name;
  local_1140 = local_1130;
  pcVar4 = (psVar12->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)&local_1140,pcVar4,pcVar4 + sVar3);
  cVar2 = local_1140[local_1138 + -1];
  cVar5 = directory::get_separator();
  if (cVar2 != cVar5) {
    directory::get_separator();
    std::__cxx11::string::push_back((char)&local_1140);
  }
  local_1120 = psVar12;
  __dirp = opendir((psVar12->_M_dataplus)._M_p);
  if (__dirp == (DIR *)0x0) {
    peVar10 = (error *)__cxa_allocate_exception(0x30);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1038,
                   "Unable to list the contents of ",local_1120);
    error::error(peVar10,(string *)local_1038);
    *(undefined ***)peVar10 = &PTR__error_0031aaa0;
    __cxa_throw(peVar10,&directory::listing_error::typeinfo,error::~error);
  }
  local_1118 = __errno_location();
  paVar1 = &local_1110.field_2;
  while( true ) {
    *local_1118 = 0;
    pdVar7 = readdir(__dirp);
    if (pdVar7 == (dirent *)0x0) break;
    local_1038 = (undefined1  [8])local_1028;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1038,local_1140,local_1140 + local_1138);
    __s = pdVar7->d_name;
    std::__cxx11::string::append((char *)local_1038);
    iVar6 = stat64((char *)local_1038,&local_10c8);
    if (local_1038 != (undefined1  [8])local_1028) {
      operator_delete((void *)local_1038);
    }
    pcVar8 = (char *)local_10c8.st_size;
    if (iVar6 != 0) {
      local_1110._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1110,local_1140,local_1140 + local_1138);
      std::__cxx11::string::append((char *)&local_1110);
      pcVar8 = (char *)readlink(local_1110._M_dataplus._M_p,local_1038,0x1000);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1110._M_dataplus._M_p != paVar1) {
        operator_delete(local_1110._M_dataplus._M_p);
      }
      if (pcVar8 == (char *)0xffffffffffffffff) {
        peVar10 = (error *)__cxa_allocate_exception(0x30);
        std::operator+(&local_1110,"Unable to list the contents of ",local_1120);
        error::error(peVar10,&local_1110);
        *(undefined ***)peVar10 = &PTR__error_0031aaa0;
        __cxa_throw(peVar10,&directory::listing_error::typeinfo,error::~error);
      }
    }
    if ((local_10c8.st_mode & 0xf000) != 0x4000) {
      dVar11.__r = local_10c8.st_mtim.tv_sec * 1000000000;
      local_1110._M_dataplus._M_p = (pointer)paVar1;
      sVar9 = strlen(__s);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1110,__s,__s + sVar9);
      local_10e8[0] = local_10d8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_10e8,local_1140,local_1140 + local_1138);
      std::__cxx11::string::append((char *)local_10e8);
      local_1030._M_p = local_1028 + 8;
      local_1028._0_8_ = 0;
      local_1028[8] = '\0';
      local_1010._M_p = (pointer)&local_1000;
      local_1008 = 0;
      local_1000._M_local_buf[0] = '\0';
      local_ff0.__d.__r = (duration)0;
      local_1038 = (undefined1  [8])pcVar8;
      std::__cxx11::string::_M_assign((string *)&local_1030);
      std::__cxx11::string::_M_assign((string *)&local_1010);
      local_ff0.__d.__r = (duration)(duration)dVar11.__r;
      if (local_10e8[0] != local_10d8) {
        operator_delete(local_10e8[0]);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1110._M_dataplus._M_p != paVar1) {
        operator_delete(local_1110._M_dataplus._M_p);
      }
      queue_kernel_1<dlib::file,_dlib::memory_manager_stateless_kernel_1<char>_>::enqueue
                (local_10f0,(file *)local_1038);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1010._M_p != &local_1000) {
        operator_delete(local_1010._M_p);
      }
      if (local_1030._M_p != local_1028 + 8) {
        operator_delete(local_1030._M_p);
      }
    }
  }
  if (*local_1118 != 0) {
    peVar10 = (error *)__cxa_allocate_exception(0x30);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1038,
                   "Unable to list the contents of ",local_1120);
    error::error(peVar10,(string *)local_1038);
    *(undefined ***)peVar10 = &PTR__error_0031aaa0;
    __cxa_throw(peVar10,&directory::listing_error::typeinfo,error::~error);
  }
  do {
    iVar6 = closedir(__dirp);
    if (iVar6 == 0) break;
  } while (*local_1118 == 4);
  if (local_1140 != local_1130) {
    operator_delete(local_1140);
  }
  return;
}

Assistant:

typename disable_if<is_std_vector<queue_of_files>,void>::type
    directory_helper_get_files (
        const directory::data& state,
        queue_of_files& files
    ) 
    {
        using namespace std;

        files.clear();
        if (state.full_name.size() == 0)
            throw directory::listing_error("This directory object currently doesn't represent any directory.");

        DIR* ffind = 0;
        struct dirent* data;
        struct stat64 buffer;

        try
        {
            string path = state.full_name;
            // ensure that the path ends with a separator
            if (path[path.size()-1] != directory::get_separator())
                path += directory::get_separator();

            // get a handle to something we can search with
            ffind = opendir(state.full_name.c_str());
            if (ffind == 0)
            {
                throw directory::listing_error("Unable to list the contents of " + state.full_name);
            }

            while(true)
            {
                errno = 0;
                if ( (data = readdir(ffind)) == 0)
                {                    
                    // there was an error or no more files
                    if ( errno == 0)
                    {
                        // there are no more files
                        break;
                    }
                    else
                    {
                        // there was an error
                        throw directory::listing_error("Unable to list the contents of " + state.full_name);
                    }                
                }

                uint64 file_size;
                // get a stat64 structure so we can see if this is a file
                if (::stat64((path+data->d_name).c_str(), &buffer) != 0)
                {
                    // this might be a broken symbolic link.  We can check by calling
                    // readlink and seeing if it finds anything.  
                    char buf[PATH_MAX];
                    ssize_t temp = readlink((path+data->d_name).c_str(),buf,sizeof(buf));
                    if (temp == -1)                    
                        throw directory::listing_error("Unable to list the contents of " + state.full_name);
                    else
                        file_size = static_cast<uint64>(temp);
                }
                else
                {
                    file_size = static_cast<uint64>(buffer.st_size);
                }
                auto last_modified = std::chrono::system_clock::from_time_t(buffer.st_mtime);
#ifdef _BSD_SOURCE 
                last_modified += std::chrono::nanoseconds(buffer.st_atim.tv_nsec);
#endif

                if (S_ISDIR(buffer.st_mode) == 0)
                {
                    // this is actually a file
                    file temp(
                        data->d_name,
                        path+data->d_name,
                        file_size,
                        last_modified,
                        file::private_constructor()
                        );
                    files.enqueue(temp);
                }
            } // while (true)

            if (ffind != 0)
            {
                while (closedir(ffind))
                {
                    if (errno != EINTR)
                        break;
                }
                ffind = 0;
            }

        }
        catch (...)
        {
            if (ffind != 0)
            {
                while (closedir(ffind))
                {
                    if (errno != EINTR)
                        break;
                }
                ffind = 0;
            }
            files.clear();
            throw;
        }
    }